

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O1

FT_Error cid_face_init(FT_Stream stream,FT_Face cidface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  ulong uVar1;
  undefined1 *puVar2;
  long *plVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar6;
  FT_Stream stream_00;
  unsigned_long uVar7;
  FT_Generic_Finalizer __s1;
  short sVar8;
  FT_Error FVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  void *pvVar13;
  FT_Face pFVar14;
  size_t sVar15;
  ulong uVar16;
  undefined8 *puVar17;
  FT_Byte *data;
  FT_Face pFVar18;
  FT_ULong FVar19;
  ulong uVar20;
  short sVar21;
  uint uVar22;
  FT_CharMap *ppFVar23;
  FT_Face pFVar24;
  long lVar25;
  short sVar26;
  FT_Byte *extraout_RDX;
  FT_Byte *extraout_RDX_00;
  FT_Byte *extraout_RDX_01;
  ulong uVar27;
  FT_Bitmap_Size **ppFVar28;
  FT_Byte *extraout_RDX_02;
  FT_Byte *extraout_RDX_03;
  FT_Byte *extraout_RDX_04;
  FT_Byte *extraout_RDX_05;
  FT_Byte *extraout_RDX_06;
  FT_Byte *extraout_RDX_07;
  FT_Byte *extraout_RDX_08;
  FT_Byte *extraout_RDX_09;
  FT_Byte *extraout_RDX_10;
  FT_Byte *extraout_RDX_11;
  FT_Byte *extraout_RDX_12;
  FT_Byte *extraout_RDX_13;
  FT_Byte *extraout_RDX_14;
  FT_Byte *extraout_RDX_15;
  FT_Byte *extraout_RDX_16;
  FT_Byte *pFVar29;
  FT_Byte *extraout_RDX_17;
  long lVar30;
  FT_Face pFVar31;
  FT_Face __nptr;
  char *pcVar32;
  FT_Face pos;
  FT_Face pFVar33;
  T1_FieldRec *pTVar34;
  undefined1 auVar35 [8];
  bool bVar36;
  byte bVar37;
  undefined1 auStack_291 [8];
  undefined1 uStack_289;
  undefined1 local_288 [280];
  ulong local_170;
  FT_Face local_168;
  FT_Bitmap_Size **local_160;
  FT_Bitmap_Size **local_158;
  FT_Bitmap_Size **local_150;
  FT_Bitmap_Size **local_148;
  undefined1 local_140 [8];
  CID_Loader loader;
  uint local_4c;
  long local_48;
  uint local_34;
  
  bVar37 = 0;
  cidface->num_faces = 1;
  if (cidface[1].face_index == 0) {
    stack0xfffffffffffffd70 = 0x200f02;
    pvVar13 = FT_Get_Module_Interface((cidface->driver->root).library,"psaux");
    if (pvVar13 == (void *)0x0) {
      return 0xb;
    }
    cidface[1].face_index = (FT_Long)pvVar13;
  }
  if (cidface[2].bbox.yMin == 0) {
    stack0xfffffffffffffd70 = 0x200f33;
    pvVar13 = FT_Get_Module_Interface((cidface->driver->root).library,"pshinter");
    cidface[2].bbox.yMin = (FT_Pos)pvVar13;
  }
  stack0xfffffffffffffd70 = 0x200f44;
  FVar9 = FT_Stream_Seek(stream,0);
  if (FVar9 != 0) {
    return FVar9;
  }
  pFVar24 = (FT_Face)cidface->memory;
  stack0xfffffffffffffd70 = 0x200f69;
  memset(local_140,0,0xd0);
  stream_00 = cidface->stream;
  lVar30 = cidface[1].face_index;
  stack0xfffffffffffffd70 = 0x200f8a;
  memset(local_140,0,200);
  stack0xfffffffffffffd70 = 0x200fa1;
  loader._200_8_ = pFVar24;
  (*(code *)**(undefined8 **)(lVar30 + 8))(local_140,0,0);
  stack0xfffffffffffffd70 = 0x200fb0;
  loader.parser.root.funcs.load_field_table =
       (_func_FT_Error_PS_Parser_T1_Field_void_ptr_ptr_FT_UInt_FT_ULong_ptr *)stream_00;
  pFVar14 = (FT_Face)FT_Stream_Pos(stream_00);
  pcVar32 = (char *)0x1f;
  stack0xfffffffffffffd70 = 0x200fc0;
  local_34 = FT_Stream_EnterFrame(stream_00,0x1f);
  pFVar29 = extraout_RDX;
  FVar19 = loader.parser.data_offset;
  if (local_34 == 0) {
    pcVar32 = "%!PS-Adobe-3.0 Resource-CIDFont";
    stack0xfffffffffffffd70 = 0x200ff1;
    iVar12 = strncmp((char *)stream_00->cursor,"%!PS-Adobe-3.0 Resource-CIDFont",0x1f);
    stack0xfffffffffffffd70 = 0x201004;
    FT_Stream_ExitFrame(stream_00);
    if (iVar12 == 0) {
      do {
        stack0xfffffffffffffd70 = 0x201588;
        pFVar18 = (FT_Face)FT_Stream_Pos(stream_00);
        uVar27 = 0x109;
        local_48 = 0;
        pFVar31 = (FT_Face)local_288;
        do {
          uVar7 = stream_00->size;
          stack0xfffffffffffffd70 = 0x2015b3;
          FVar19 = FT_Stream_Pos(stream_00);
          uVar20 = uVar7 - FVar19;
          if (uVar27 < uVar20) {
            uVar20 = uVar27;
          }
          uVar27 = uVar20;
          stack0xfffffffffffffd70 = 0x2015cb;
          pcVar32 = (char *)pFVar31;
          local_34 = FT_Stream_Read(stream_00,(FT_Byte *)pFVar31,uVar27);
          pFVar29 = extraout_RDX_06;
          if (local_34 == 0) {
            puVar2 = (undefined1 *)((long)&pFVar31->num_faces + uVar27);
            pFVar33 = (FT_Face)(puVar2 + -6);
            *puVar2 = 0;
            pFVar31 = (FT_Face)local_288;
            if (pFVar31 < pFVar33) {
              pos = (FT_Face)((long)&pFVar18->num_faces + 7);
              pFVar31 = (FT_Face)local_288;
              do {
                if (*(char *)&pFVar31->num_faces == 'S') {
                  pcVar32 = "StartData";
                  stack0xfffffffffffffd70 = 0x20162a;
                  iVar12 = strncmp((char *)pFVar31,"StartData",9);
                  pFVar29 = extraout_RDX_07;
                  if (iVar12 != 0) goto LAB_00201632;
                  pos = (FT_Face)((long)&pos->num_faces + 3);
LAB_002016bc:
                  pFVar24 = (FT_Face)CONCAT71((int7)((ulong)pFVar24 >> 8),1);
                  local_34 = 0;
                  bVar36 = false;
                  goto LAB_002015d9;
                }
LAB_00201632:
                if (*(char *)((long)&pFVar31->num_faces + 1) == 's') {
                  pcVar32 = "/sfnts";
                  stack0xfffffffffffffd70 = 0x20164c;
                  iVar12 = strncmp((char *)pFVar31,"/sfnts",6);
                  pFVar29 = extraout_RDX_08;
                  if (iVar12 == 0) goto LAB_002016bc;
                }
                pFVar31 = (FT_Face)((long)&pFVar31->num_faces + 1);
                pos = (FT_Face)((long)&pos->num_faces + 1);
              } while (pFVar31 < pFVar33);
            }
            local_34 = 0;
            if (local_48 + uVar27 < 9) {
              local_34 = 3;
              goto LAB_002015d2;
            }
            local_288._0_8_ = *(undefined8 *)(local_288 + local_48 + (uVar27 - 9));
            local_288[8] = (local_288 + local_48)[uVar27 - 1];
            bVar36 = true;
            local_48 = 9;
            uVar27 = 0x100;
            pFVar31 = (FT_Face)(local_288 + 9);
          }
          else {
LAB_002015d2:
            bVar36 = false;
          }
          pFVar24 = (FT_Face)0x0;
          pos = pFVar18;
LAB_002015d9:
          pFVar18 = (FT_Face)&pos[1].face_index;
        } while (bVar36);
        FVar19 = loader.parser.data_offset;
        if ((char)pFVar24 == '\0') break;
        stack0xfffffffffffffd70 = 0x2016e3;
        pcVar32 = (char *)pFVar14;
        local_34 = FT_Stream_Seek(stream_00,(FT_ULong)pFVar14);
        pFVar29 = extraout_RDX_09;
        FVar19 = loader.parser.data_offset;
        if (local_34 != 0) break;
        pFVar31 = (FT_Face)((long)pos - (long)pFVar14);
        stack0xfffffffffffffd70 = 0x201703;
        pcVar32 = (char *)pFVar31;
        local_34 = FT_Stream_ExtractFrame
                             (stream_00,(FT_ULong)pFVar31,(FT_Byte **)&loader.parser.stream);
        pFVar18 = (FT_Face)loader.parser.stream;
        pFVar29 = extraout_RDX_10;
        FVar19 = loader.parser.data_offset;
        if (local_34 != 0) break;
        loader.parser.root.cursor = (FT_Byte *)loader.parser.stream;
        local_140 = (undefined1  [8])loader.parser.stream;
        loader.parser.root.base =
             (FT_Byte *)((long)&(loader.parser.stream)->base + (long)&pFVar31->num_faces);
        loader.parser.cid._0_4_ = -1;
        stack0xfffffffffffffd70 = 0x20174f;
        loader.parser.postscript = (FT_Byte *)pFVar31;
        loader.parser.postscript_len = (FT_ULong)pos;
        (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_140);
        stack0xfffffffffffffd70 = 0x201758;
        (*loader.parser.root.funcs.done)((PS_Parser)local_140);
        auVar35 = local_140;
        stack0xfffffffffffffd70 = 0x201768;
        (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_140);
        stack0xfffffffffffffd70 = 0x201771;
        (*loader.parser.root.funcs.done)((PS_Parser)local_140);
        pFVar31 = (FT_Face)(loader.parser.root.base + -6);
        pFVar24 = pFVar31;
        if ((ulong)local_140 <= pFVar31) {
          pFVar33 = (FT_Face)(loader.parser.root.base + -9);
          pFVar29 = extraout_RDX_11;
          do {
            __nptr = (FT_Face)auVar35;
            auVar35 = local_140;
            local_34 = (uint)loader.parser.root.limit;
            FVar19 = loader.parser.data_offset;
            if ((uint)loader.parser.root.limit != 0) goto LAB_00201012;
            bVar36 = *(FT_Byte *)(void **)local_140 != 'S';
            pFVar24 = (FT_Face)CONCAT71((int7)((ulong)pFVar24 >> 8),
                                        pFVar33 < (ulong)local_140 || bVar36);
            if (pFVar33 >= (ulong)local_140 && !bVar36) {
              pcVar32 = "StartData";
              stack0xfffffffffffffd70 = 0x2017d4;
              iVar12 = strncmp((char *)local_140,"StartData",9);
              if (iVar12 == 0) {
                pcVar32 = "(Hex)";
                stack0xfffffffffffffd70 = 0x2019fd;
                iVar12 = strncmp((char *)pFVar18,"(Hex)",5);
                local_34 = 0;
                pFVar29 = extraout_RDX_15;
                FVar19 = loader.parser.data_offset;
                if (iVar12 == 0) {
                  local_34 = 0;
                  pcVar32 = (char *)0x0;
                  stack0xfffffffffffffd70 = 0x201a1a;
                  FVar19 = strtol((char *)__nptr,(char **)0x0,10);
                  pFVar29 = extraout_RDX_16;
                  if ((long)FVar19 < 0) {
                    local_34 = 3;
                    FVar19 = loader.parser.data_offset;
                  }
                }
                goto LAB_00201012;
              }
            }
            if (*(FT_Byte *)((long)(void **)auVar35 + 1) == 's') {
              pcVar32 = "/sfnts";
              stack0xfffffffffffffd70 = 0x2017f6;
              iVar12 = strncmp((char *)auVar35,"/sfnts",6);
              if (iVar12 == 0) {
                local_34 = 2;
                pFVar29 = extraout_RDX_12;
                FVar19 = loader.parser.data_offset;
                goto LAB_00201012;
              }
            }
            stack0xfffffffffffffd70 = 0x20180e;
            (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_140);
            stack0xfffffffffffffd70 = 0x201817;
            (*loader.parser.root.funcs.done)((PS_Parser)local_140);
            pFVar29 = extraout_RDX_13;
            pFVar18 = __nptr;
          } while ((ulong)local_140 <= pFVar31);
        }
        stack0xfffffffffffffd70 = 0x20183e;
        FT_Stream_ReleaseFrame(stream_00,(FT_Byte **)&loader.parser.stream);
        stack0xfffffffffffffd70 = 0x201849;
        local_34 = FT_Stream_Seek(stream_00,(FT_ULong)pos);
        pFVar29 = extraout_RDX_14;
        pcVar32 = (char *)pos;
        FVar19 = loader.parser.data_offset;
      } while (local_34 == 0);
    }
    else {
      pFVar29 = extraout_RDX_00;
      local_34 = (uint)(iVar12 != 0) * 2;
      FVar19 = loader.parser.data_offset;
    }
  }
LAB_00201012:
  loader.parser.data_offset = FVar19;
  if (local_34 == 0) {
    pFVar24 = (FT_Face)(loader.parser.postscript + (long)&(loader.parser.stream)->base);
    loader.parser.root.limit._0_4_ = 0;
    pFVar14 = (FT_Face)((undefined1 *)((long)&loader.parser.stream[-1].memory + 6) +
                       (long)loader.parser.postscript);
    local_160 = (FT_Bitmap_Size **)&cidface[1].face_flags;
    local_158 = (FT_Bitmap_Size **)&cidface[1].bbox.xMax;
    local_150 = (FT_Bitmap_Size **)&cidface[2].generic.finalizer;
    local_148 = &cidface[1].available_sizes;
    local_34 = 0;
    pFVar18 = (FT_Face)loader.parser.stream;
    loader.parser.root.base = (FT_Byte *)pFVar24;
    do {
      stack0xfffffffffffffd70 = 0x2011b3;
      local_140 = (undefined1  [8])pFVar18;
      (*loader.parser.root.funcs.done)((PS_Parser)local_140);
      auVar35 = local_140;
      pFVar31 = (FT_Face)((long)&(((FT_Face)((long)local_140 + -0xf8))->autohint).finalizer + 7);
      if (pFVar24 <= (ulong)local_140) {
        pFVar31 = pFVar14;
      }
      if (pFVar18 < pFVar31) {
        lVar30 = (long)pFVar31 - (long)pFVar18;
        iVar12 = (int)loader.parser.cid;
        do {
          if (*(FT_Byte *)&pFVar18->num_faces == '%') {
            pcVar32 = "%ADOBeginFontDict";
            stack0xfffffffffffffd70 = 0x2011e9;
            iVar10 = strncmp((char *)pFVar18,"%ADOBeginFontDict",0x11);
            if ((iVar10 == 0) && (0 < cidface[2].num_charmaps)) {
              iVar12 = iVar12 + 1;
              loader.parser.cid._0_4_ = iVar12;
            }
          }
          pFVar18 = (FT_Face)((long)&pFVar18->num_faces + 1);
          lVar30 = lVar30 + -1;
        } while (lVar30 != 0);
      }
      uVar22 = 2;
      if ((ulong)auVar35 < pFVar24) {
        stack0xfffffffffffffd70 = 0x201228;
        (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_140);
        if (((ulong)local_140 < pFVar24) && ((uint)loader.parser.root.limit == 0)) {
          pcVar32 = (char *)((long)(void **)auVar35 + 2);
          if (pcVar32 < pFVar24 && *(FT_Byte *)(void **)auVar35 == '/') {
            pFVar18 = (FT_Face)((long)(void **)auVar35 + 1);
            uVar27 = (long)local_140 - (long)pFVar18;
            uVar22 = 0;
            local_168 = (FT_Face)pcVar32;
            if ((uint)uVar27 - 1 < 0x15) {
              uVar20 = uVar27 & 0xffffffff;
              pTVar34 = cid_field_records;
              local_170 = uVar27;
              do {
                pFVar29 = (FT_Byte *)((FT_Face)pTVar34)->num_faces;
                if (pFVar29 == (FT_Byte *)0x0) {
                  uVar22 = 7;
                }
                else {
                  if (*(FT_Byte *)&pFVar18->num_faces == *pFVar29) {
                    stack0xfffffffffffffd70 = 0x2012c2;
                    sVar15 = strlen((char *)pFVar29);
                    if (uVar20 == sVar15) {
                      bVar36 = 1 < (uint)uVar27;
                      if ((uint)local_170 < 2) {
LAB_0020132f:
                        iVar12 = *(int *)((long)&((FT_Face)pTVar34)->face_index + 4);
                        if (iVar12 == 0xb) {
                          pcVar32 = local_140;
                          stack0xfffffffffffffd70 = 0x201349;
                          (*(code *)((FT_Face)pTVar34)->face_flags)(cidface,pcVar32);
                          uVar11 = (uint)loader.parser.root.limit;
                        }
                        else {
                          ppFVar28 = local_160;
                          switch((int)((FT_Face)pTVar34)->face_index) {
                          case 0:
                            break;
                          default:
                            if (((long)(int)loader.parser.cid < 0) ||
                               (cidface[2].num_charmaps <= (int)loader.parser.cid)) {
                              pcVar32 = (char *)0x0;
                            }
                            else {
                              pcVar32 = (char *)CONCAT71((int7)((ulong)cidface >> 8),1);
                              ppFVar28 = (FT_Bitmap_Size **)
                                         (cidface[2].charmaps + (long)(int)loader.parser.cid * 0x2a)
                              ;
                            }
                            uVar11 = 0xa0;
                            if ((char)pcVar32 == '\0') goto LAB_00201402;
                            break;
                          case 2:
                            ppFVar28 = local_150;
                            break;
                          case 3:
                            ppFVar28 = local_148;
                            break;
                          case 5:
                            ppFVar28 = local_158;
                          }
                          pcVar32 = (char *)pTVar34;
                          local_288._0_8_ = ppFVar28;
                          if (iVar12 - 9U < 2) {
                            stack0xfffffffffffffd70 = 0x2013f3;
                            uVar11 = (*loader.parser.root.funcs.load_field)
                                               ((PS_Parser)local_140,pTVar34,(void **)local_288,0,
                                                (FT_ULong *)0x0);
                          }
                          else {
                            stack0xfffffffffffffd70 = 0x201400;
                            uVar11 = (*loader.parser.root.funcs.to_token_array)
                                               ((PS_Parser)local_140,(T1_Token)pTVar34,
                                                (FT_UInt)local_288,(FT_Int *)0x0);
                          }
                        }
LAB_00201402:
                        uVar22 = 1;
                        loader.parser.root.limit._0_4_ = uVar11;
                        if (uVar11 == 0) {
                          uVar22 = 7;
                          uVar11 = local_4c;
                        }
                      }
                      else {
                        bVar36 = true;
                        if (*(FT_Byte *)&local_168->num_faces == pFVar29[1]) {
                          uVar16 = 1;
                          do {
                            if ((2 - uVar20) + uVar16 == 1) {
                              bVar36 = false;
                              goto LAB_0020132f;
                            }
                            lVar30 = uVar16 + 2;
                            uVar1 = uVar16 + 1;
                            lVar25 = uVar16 + 1;
                            uVar16 = uVar1;
                          } while (*(FT_Byte *)((long)(void **)auVar35 + lVar30) == pFVar29[lVar25])
                          ;
                          bVar36 = uVar1 < uVar20;
                        }
                        uVar22 = 0;
                        uVar11 = local_4c;
                        if (!bVar36) goto LAB_0020132f;
                      }
                      local_4c = uVar11;
                      if (!bVar36) goto LAB_0020142b;
                    }
                  }
                  pTVar34 = (T1_FieldRec *)&((FT_Face)pTVar34)->style_name;
                  uVar22 = 0;
                }
LAB_0020142b:
              } while (uVar22 == 0);
              if (uVar22 == 7) {
                uVar22 = 0;
              }
            }
            auVar35 = (undefined1  [8])pFVar18;
            if (uVar22 != 0) goto LAB_00201460;
          }
          uVar22 = 0;
          auVar35 = local_140;
        }
        else {
          uVar22 = 2;
        }
      }
LAB_00201460:
      pFVar18 = (FT_Face)auVar35;
    } while (uVar22 == 0);
    if (uVar22 == 2) {
      bVar36 = cidface[2].num_charmaps == 0;
      pFVar29 = (FT_Byte *)(ulong)bVar36;
      if (bVar36) {
        local_4c = 3;
      }
    }
    else {
      pFVar29 = (FT_Byte *)(ulong)uVar22;
    }
    local_34 = local_4c;
    if ((int)pFVar29 == 0) {
      local_34 = (uint)loader.parser.root.limit;
    }
    pFVar24 = (FT_Face)(ulong)local_34;
    if ((-1 < face_index) && (local_34 == 0)) {
      pcVar32 = (char *)0x50;
      stack0xfffffffffffffd70 = 0x2014d0;
      puVar17 = (undefined8 *)ft_mem_alloc((FT_Memory)loader._200_8_,0x50,(FT_Error *)&local_34);
      pFVar14 = (FT_Face)loader.parser.data_offset;
      cidface[2].bbox.yMax = (FT_Pos)puVar17;
      pFVar29 = extraout_RDX_02;
      if (local_34 == 0) {
        if (loader.parser.data_offset == 0) {
          pcVar32 = (char *)cidface->stream;
          for (lVar30 = 10; lVar30 != 0; lVar30 = lVar30 + -1) {
            *puVar17 = (void *)((FT_Face)pcVar32)->num_faces;
            pcVar32 = (char *)((long)pcVar32 + (ulong)bVar37 * -0x10 + 8);
            puVar17 = puVar17 + (ulong)bVar37 * -2 + 1;
          }
          pFVar24 = (FT_Face)0x0;
          pvVar13 = (void *)loader.parser.postscript_len;
LAB_002019ad:
          cidface[2].generic.data = pvVar13;
          iVar12 = cidface[2].num_fixed_sizes;
          if (-1 < iVar12) {
            uVar22 = *(uint *)&cidface[2].field_0x3c;
            pcVar32 = (char *)(ulong)uVar22;
            if ((0 < (int)uVar22) &&
               (pFVar24 = (FT_Face)CONCAT71((int7)((ulong)pFVar24 >> 8),(int)uVar22 < 5),
               iVar12 < 5 && (int)uVar22 < 5)) {
              pFVar24 = (FT_Face)(*(long *)(cidface[2].bbox.yMax + 8) -
                                 (long)cidface[2].generic.data);
              if (0 < (long)cidface[2].num_charmaps) {
                ppFVar23 = cidface[2].charmaps;
                lVar30 = 0;
                do {
                  iVar10 = *(int *)((long)ppFVar23 + lVar30 + 0x148);
                  uVar27 = (ulong)iVar10;
                  if ((long)uVar27 < 0) goto LAB_002019dd;
                  uVar11 = *(uint *)((long)ppFVar23 + lVar30 + 0x138);
                  if (((((iVar10 == 0) && (uVar11 != 0)) || (4 < iVar10)) ||
                      ((plVar3 = (long *)((long)ppFVar23 + lVar30 + 0x140),
                       uVar20 = (long)pFVar24 - *plVar3, pFVar24 < (FT_Face)*plVar3 ||
                       ((int)uVar11 < 0)))) ||
                     ((iVar10 != 0 &&
                      (pFVar29 = (FT_Byte *)(uVar20 % uVar27), uVar20 / uVar27 < (ulong)uVar11))))
                  goto LAB_002019dd;
                  lVar30 = lVar30 + 0x150;
                } while ((long)cidface[2].num_charmaps * 0x150 - lVar30 != 0);
              }
              bVar36 = (FT_Face)cidface[2].style_name <= pFVar24;
              pFVar24 = (FT_Face)((long)pFVar24 - (long)cidface[2].style_name);
              if (bVar36) {
                pcVar32 = (char *)(ulong)(uVar22 + iVar12);
                pFVar29 = (FT_Byte *)((ulong)pFVar24 % (ulong)pcVar32);
                if (cidface[2].available_sizes <=
                    (FT_Bitmap_Size *)((ulong)pFVar24 / (ulong)pcVar32)) {
                  stack0xfffffffffffffd70 = 0x201b18;
                  local_34 = cid_read_subrs((CID_Face)cidface);
                  pFVar29 = extraout_RDX_17;
                  goto LAB_00201027;
                }
              }
            }
          }
LAB_002019dd:
          local_34 = 3;
        }
        else {
          uVar27 = (long)((FT_Face)cidface->stream)->face_index - loader.parser.postscript_len;
          if (uVar27 < loader.parser.data_offset) {
            loader.parser.data_offset = uVar27;
          }
          stack0xfffffffffffffd70 = 0x201523;
          pcVar32 = (char *)loader.parser.data_offset;
          data = (FT_Byte *)
                 ft_mem_alloc((FT_Memory)loader._200_8_,loader.parser.data_offset,
                              (FT_Error *)&local_34);
          cidface[2].bbox.xMax = (FT_Pos)data;
          pFVar24 = pFVar14;
          pFVar29 = extraout_RDX_03;
          if (local_34 == 0) {
            stack0xfffffffffffffd70 = 0x20154d;
            pFVar24 = cidface;
            pcVar32 = (char *)loader.parser.data_offset;
            local_34 = cid_hex_to_binary(data,loader.parser.data_offset,loader.parser.postscript_len
                                         ,(CID_Face)cidface);
            pFVar29 = extraout_RDX_04;
            if (local_34 == 0) {
              pcVar32 = (char *)cidface[2].bbox.xMax;
              stack0xfffffffffffffd70 = 0x201574;
              FT_Stream_OpenMemory
                        ((FT_Stream)cidface[2].bbox.yMax,(FT_Byte *)pcVar32,
                         loader.parser.data_offset);
              pvVar13 = (void *)0x0;
              pFVar29 = extraout_RDX_05;
              goto LAB_002019ad;
            }
          }
        }
      }
    }
  }
LAB_00201027:
  if (loader.parser.stream != (FT_Stream)0x0) {
    pcVar32 = (char *)&loader.parser.stream;
    stack0xfffffffffffffd70 = 0x201041;
    FT_Stream_ReleaseFrame((FT_Stream)loader.parser.root.funcs.load_field_table,(FT_Byte **)pcVar32)
    ;
    pFVar29 = extraout_RDX_01;
  }
  stack0xfffffffffffffd70 = 0x20104b;
  (*loader.parser.root.funcs.init)
            ((PS_Parser)local_140,(FT_Byte *)pcVar32,pFVar29,(FT_Memory)pFVar24);
  if (face_index < 0 || local_34 != 0) {
    return local_34;
  }
  if ((short)face_index != 0) {
    return 6;
  }
  cidface->num_glyphs = (FT_Long)cidface[2].available_sizes;
  cidface->num_charmaps = 0;
  cidface->face_index = 0;
  uVar27 = cidface->face_flags;
  cidface->face_flags = uVar27 | 0x811;
  if ((char)cidface[1].bbox.yMin != '\0') {
    cidface->face_flags = uVar27 | 0x815;
  }
  pcVar32 = (char *)cidface[1].generic.data;
  cidface->family_name = pcVar32;
  cidface->style_name = "Regular";
  if (pcVar32 == (char *)0x0) {
    if ((FT_String *)cidface[1].face_flags != (FT_String *)0x0) {
      cidface->family_name = (FT_String *)cidface[1].face_flags;
    }
  }
  else {
    ppFVar23 = cidface[1].charmaps;
    if (ppFVar23 != (FT_CharMap *)0x0) {
      while (cVar4 = *(char *)ppFVar23, cVar4 != '\0') {
        cVar5 = *pcVar32;
        if (cVar4 == cVar5) {
          pcVar32 = pcVar32 + 1;
LAB_00201110:
          ppFVar23 = (FT_CharMap *)((long)ppFVar23 + 1);
        }
        else {
          if ((cVar4 == '-') || (cVar4 == ' ')) goto LAB_00201110;
          if ((cVar5 != ' ') && (cVar5 != '-')) {
            if (cVar5 == '\0') {
              cidface->style_name = (FT_String *)ppFVar23;
            }
            break;
          }
          pcVar32 = pcVar32 + 1;
        }
      }
    }
  }
  uVar27 = (ulong)(cidface[1].bbox.xMin != 0);
  cidface->style_flags = uVar27;
  __s1 = cidface[1].generic.finalizer;
  if (__s1 != (FT_Generic_Finalizer)0x0) {
    stack0xfffffffffffffd70 = 0x20189c;
    iVar12 = strcmp((char *)__s1,"Bold");
    if (iVar12 != 0) {
      stack0xfffffffffffffd70 = 0x2018af;
      iVar12 = strcmp((char *)__s1,"Black");
      if (iVar12 != 0) goto LAB_002018bc;
    }
    cidface->style_flags = uVar27 | 2;
  }
LAB_002018bc:
  cidface->num_fixed_sizes = 0;
  cidface->available_sizes = (FT_Bitmap_Size *)0x0;
  lVar30 = cidface[1].bbox.yMax;
  (cidface->bbox).xMin = cidface[1].bbox.xMax >> 0x10;
  (cidface->bbox).yMin = lVar30 >> 0x10;
  (cidface->bbox).xMax = *(long *)&cidface[1].units_per_EM + 0xffff >> 0x10;
  lVar25 = *(long *)&cidface[1].max_advance_width + 0xffff;
  (cidface->bbox).yMax = lVar25 >> 0x10;
  if (cidface->units_per_EM == 0) {
    cidface->units_per_EM = 1000;
  }
  sVar21 = (short)((ulong)lVar25 >> 0x10);
  cidface->ascender = sVar21;
  sVar8 = (short)((ulong)lVar30 >> 0x10);
  cidface->descender = sVar8;
  sVar26 = (short)((ulong)((uint)cidface->units_per_EM * 0xc) * 0x1999999a >> 0x20);
  iVar12 = (int)sVar21 - (int)sVar8;
  sVar8 = (short)iVar12;
  if (iVar12 <= sVar26) {
    sVar8 = sVar26;
  }
  cidface->height = sVar8;
  uVar6 = *(undefined4 *)((long)&cidface[1].bbox.yMin + 2);
  cidface->underline_position = (short)uVar6;
  cidface->underline_thickness = (short)((uint)uVar6 >> 0x10);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_face_init( FT_Stream      stream,
                 FT_Face        cidface,        /* CID_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    CID_Face          face = (CID_Face)cidface;
    FT_Error          error;
    PSAux_Service     psaux;
    PSHinter_Service  pshinter;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    cidface->num_faces = 1;

    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      psaux = (PSAux_Service)FT_Get_Module_Interface(
                FT_FACE_LIBRARY( face ), "psaux" );

      if ( !psaux )
      {
        FT_ERROR(( "cid_face_init: cannot access `psaux' module\n" ));
        error = FT_THROW( Missing_Module );
        goto Exit;
      }

      face->psaux = psaux;
    }

    pshinter = (PSHinter_Service)face->pshinter;
    if ( !pshinter )
    {
      pshinter = (PSHinter_Service)FT_Get_Module_Interface(
                   FT_FACE_LIBRARY( face ), "pshinter" );

      face->pshinter = pshinter;
    }

    FT_TRACE2(( "CID driver\n" ));

    /* open the tokenizer; this will also check the font format */
    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    error = cid_face_open( face, face_index );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    /* XXX: handle CID fonts with more than a single face */
    if ( ( face_index & 0xFFFF ) != 0 )
    {
      FT_ERROR(( "cid_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* now load the font program into the face object */

    /* initialize the face object fields */

    /* set up root face fields */
    {
      CID_FaceInfo  cid  = &face->cid;
      PS_FontInfo   info = &cid->font_info;


      cidface->num_glyphs   = (FT_Long)cid->cid_count;
      cidface->num_charmaps = 0;

      cidface->face_index = face_index & 0xFFFF;

      cidface->face_flags |= FT_FACE_FLAG_SCALABLE   | /* scalable outlines */
                             FT_FACE_FLAG_HORIZONTAL | /* horizontal data   */
                             FT_FACE_FLAG_HINTER;      /* has native hinter */

      if ( info->is_fixed_pitch )
        cidface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* XXX: TODO: add kerning with .afm support */

      /* get style name -- be careful, some broken fonts only */
      /* have a /FontName dictionary entry!                   */
      cidface->family_name = info->family_name;
      /* assume "Regular" style if we don't know better */
      cidface->style_name = (char *)"Regular";
      if ( cidface->family_name )
      {
        char*  full   = info->full_name;
        char*  family = cidface->family_name;


        if ( full )
        {
          while ( *full )
          {
            if ( *full == *family )
            {
              family++;
              full++;
            }
            else
            {
              if ( *full == ' ' || *full == '-' )
                full++;
              else if ( *family == ' ' || *family == '-' )
                family++;
              else
              {
                if ( !*family )
                  cidface->style_name = full;
                break;
              }
            }
          }
        }
      }
      else
      {
        /* do we have a `/FontName'? */
        if ( cid->cid_font_name )
          cidface->family_name = cid->cid_font_name;
      }

      /* compute style flags */
      cidface->style_flags = 0;
      if ( info->italic_angle )
        cidface->style_flags |= FT_STYLE_FLAG_ITALIC;
      if ( info->weight )
      {
        if ( !ft_strcmp( info->weight, "Bold"  ) ||
             !ft_strcmp( info->weight, "Black" ) )
          cidface->style_flags |= FT_STYLE_FLAG_BOLD;
      }

      /* no embedded bitmap support */
      cidface->num_fixed_sizes = 0;
      cidface->available_sizes = NULL;

      cidface->bbox.xMin =   cid->font_bbox.xMin            >> 16;
      cidface->bbox.yMin =   cid->font_bbox.yMin            >> 16;
      /* no `U' suffix here to 0xFFFF! */
      cidface->bbox.xMax = ( cid->font_bbox.xMax + 0xFFFF ) >> 16;
      cidface->bbox.yMax = ( cid->font_bbox.yMax + 0xFFFF ) >> 16;

      if ( !cidface->units_per_EM )
        cidface->units_per_EM = 1000;

      cidface->ascender  = (FT_Short)( cidface->bbox.yMax );
      cidface->descender = (FT_Short)( cidface->bbox.yMin );

      cidface->height = (FT_Short)( ( cidface->units_per_EM * 12 ) / 10 );
      if ( cidface->height < cidface->ascender - cidface->descender )
        cidface->height = (FT_Short)( cidface->ascender - cidface->descender );

      cidface->underline_position  = (FT_Short)info->underline_position;
      cidface->underline_thickness = (FT_Short)info->underline_thickness;
    }

  Exit:
    return error;
  }